

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O0

void __thiscall QThread::exit(QThread *this,int __status)

{
  long lVar1;
  QThreadPrivate *pQVar2;
  qsizetype qVar3;
  const_reference ppQVar4;
  long in_FS_OFFSET;
  QEventLoop *eventLoop;
  int i;
  QThreadPrivate *d;
  QMutexLocker<QMutex> locker;
  QMutex *in_stack_ffffffffffffff98;
  QMutexLocker<QMutex> *in_stack_ffffffffffffffa0;
  int local_34;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QThread *)0x557509);
  QMutexLocker<QMutex>::QMutexLocker(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  pQVar2->exited = true;
  pQVar2->returnCode = __status;
  pQVar2->data->quitNow = true;
  local_34 = 0;
  while( true ) {
    qVar3 = QList<QEventLoop_*>::size((QList<QEventLoop_*> *)pQVar2->data);
    if (qVar3 <= local_34) break;
    ppQVar4 = QList<QEventLoop_*>::at
                        ((QList<QEventLoop_*> *)in_stack_ffffffffffffffa0,
                         (qsizetype)in_stack_ffffffffffffff98);
    QEventLoop::exit(*ppQVar4,__status);
    local_34 = local_34 + 1;
  }
  QMutexLocker<QMutex>::~QMutexLocker(in_stack_ffffffffffffffa0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QThread::exit(int returnCode)
{
    Q_D(QThread);
    QMutexLocker locker(&d->mutex);
    d->exited = true;
    d->returnCode = returnCode;
    d->data->quitNow = true;
    for (int i = 0; i < d->data->eventLoops.size(); ++i) {
        QEventLoop *eventLoop = d->data->eventLoops.at(i);
        eventLoop->exit(returnCode);
    }
}